

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyMan.c
# Opt level: O1

void Ivy_ManMakeSeq(Ivy_Man_t *p,int nLatches,int *pInits)

{
  Ivy_Obj_t *pIVar1;
  Vec_Ptr_t *pVVar2;
  uint uVar3;
  Ivy_Obj_t *pFan0;
  void **ppvVar4;
  Ivy_Init_t Init;
  int iVar5;
  ulong uVar6;
  int iVar7;
  
  if (nLatches == 0) {
    return;
  }
  if ((p->nObjs[1] <= nLatches) || (p->nObjs[2] <= nLatches)) {
    __assert_fail("nLatches < Ivy_ManPiNum(p) && nLatches < Ivy_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyMan.c"
                  ,0x1e9,"void Ivy_ManMakeSeq(Ivy_Man_t *, int, int *)");
  }
  if (p->nObjs[1] != p->vPis->nSize) {
    __assert_fail("Ivy_ManPiNum(p) == Vec_PtrSize(p->vPis)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyMan.c"
                  ,0x1ea,"void Ivy_ManMakeSeq(Ivy_Man_t *, int, int *)");
  }
  if (p->nObjs[2] != p->vPos->nSize) {
    __assert_fail("Ivy_ManPoNum(p) == Vec_PtrSize(p->vPos)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyMan.c"
                  ,0x1eb,"void Ivy_ManMakeSeq(Ivy_Man_t *, int, int *)");
  }
  if (p->vBufs->nSize != 0) {
    __assert_fail("Vec_PtrSize( p->vBufs ) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyMan.c"
                  ,0x1ec,"void Ivy_ManMakeSeq(Ivy_Man_t *, int, int *)");
  }
  if (p->fFanout == 0) {
    Ivy_ManStartFanout(p);
  }
  if (0 < nLatches) {
    iVar5 = -nLatches;
    uVar6 = 0;
    do {
      if (pInits == (int *)0x0) {
        Init = IVY_INIT_0;
      }
      else {
        Init = pInits[uVar6];
      }
      uVar3 = p->nObjs[2] + iVar5;
      if (((int)uVar3 < 0) || (p->vPos->nSize <= (int)uVar3)) {
LAB_007eb69e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pIVar1 = (Ivy_Obj_t *)p->vPos->pArray[uVar3];
      pFan0 = Ivy_Latch(p,pIVar1->pFanin0,Init);
      Ivy_ObjDisconnect(p,pIVar1);
      iVar7 = pIVar1->Id;
      if (((long)iVar7 < 0) || (p->vObjs->nSize <= iVar7)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
      }
      p->vObjs->pArray[iVar7] = (void *)0x0;
      pIVar1->field_0x8 = pIVar1->field_0x8 & 0xf0;
      *(Ivy_Obj_t **)pIVar1 = p->pListFree;
      p->pListFree = pIVar1;
      uVar3 = p->nObjs[1] + iVar5;
      if (((int)uVar3 < 0) || (p->vPis->nSize <= (int)uVar3)) goto LAB_007eb69e;
      pIVar1 = (Ivy_Obj_t *)p->vPis->pArray[uVar3];
      *(uint *)&pIVar1->field_0x8 = *(uint *)&pIVar1->field_0x8 & 0xfffffff0 | 7;
      Ivy_ObjConnect(p,pIVar1,pFan0,(Ivy_Obj_t *)0x0);
      pVVar2 = p->vBufs;
      uVar3 = pVVar2->nCap;
      if (pVVar2->nSize == uVar3) {
        if ((int)uVar3 < 0x10) {
          if (pVVar2->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar2->pArray,0x80);
          }
          pVVar2->pArray = ppvVar4;
          iVar7 = 0x10;
        }
        else {
          iVar7 = uVar3 * 2;
          if (iVar7 <= (int)uVar3) goto LAB_007eb5bd;
          if (pVVar2->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar3 << 4);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar2->pArray,(ulong)uVar3 << 4);
          }
          pVVar2->pArray = ppvVar4;
        }
        pVVar2->nCap = iVar7;
      }
LAB_007eb5bd:
      iVar7 = pVVar2->nSize;
      pVVar2->nSize = iVar7 + 1;
      pVVar2->pArray[iVar7] = pIVar1;
      uVar6 = uVar6 + 1;
      iVar5 = iVar5 + 1;
    } while ((uint)nLatches != uVar6);
  }
  iVar5 = p->nObjs[1] - nLatches;
  if (iVar5 <= p->vPis->nSize) {
    p->vPis->nSize = iVar5;
    iVar5 = p->nObjs[2] - nLatches;
    if (iVar5 <= p->vPos->nSize) {
      p->vPos->nSize = iVar5;
      p->nObjs[1] = p->nObjs[1] - nLatches;
      p->nObjs[2] = p->nObjs[2] - nLatches;
      p->nObjs[7] = p->nObjs[7] + nLatches;
      p->nDeleted = p->nDeleted + nLatches * -2;
      Ivy_ManCleanup(p);
      Ivy_ManCleanupSeq(p);
      Ivy_ManPropagateBuffers(p,0);
      if (p->nObjs[7] != 0) {
        printf("The number of remaining buffers is %d.\n");
      }
      Ivy_ManResetLevels(p);
      iVar5 = Ivy_ManCheck(p);
      if (iVar5 != 0) {
        return;
      }
      puts("Ivy_ManMakeSeq(): The check has failed.");
      return;
    }
  }
  __assert_fail("p->nSize >= nSizeNew",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
}

Assistant:

void Ivy_ManMakeSeq( Ivy_Man_t * p, int nLatches, int * pInits )
{
    Ivy_Obj_t * pObj, * pLatch;
    Ivy_Init_t Init;
    int i;
    if ( nLatches == 0 )
        return;
    assert( nLatches < Ivy_ManPiNum(p) && nLatches < Ivy_ManPoNum(p) );
    assert( Ivy_ManPiNum(p) == Vec_PtrSize(p->vPis) );
    assert( Ivy_ManPoNum(p) == Vec_PtrSize(p->vPos) );
    assert( Vec_PtrSize( p->vBufs ) == 0 );
    // create fanouts
    if ( p->fFanout == 0 )
        Ivy_ManStartFanout( p );
    // collect the POs to be converted into latches
    for ( i = 0; i < nLatches; i++ )
    {
        // get the latch value
        Init = pInits? (Ivy_Init_t)pInits[i] : IVY_INIT_0;
        // create latch
        pObj = Ivy_ManPo( p, Ivy_ManPoNum(p) - nLatches + i );
        pLatch = Ivy_Latch( p, Ivy_ObjChild0(pObj), Init );
        Ivy_ObjDisconnect( p, pObj );
        // recycle the old PO object
        Vec_PtrWriteEntry( p->vObjs, pObj->Id, NULL );
        Ivy_ManRecycleMemory( p, pObj );
        // convert the corresponding PI to a buffer and connect it to the latch
        pObj = Ivy_ManPi( p, Ivy_ManPiNum(p) - nLatches + i );
        pObj->Type = IVY_BUF;
        Ivy_ObjConnect( p, pObj, pLatch, NULL );
        // save the buffer
        Vec_PtrPush( p->vBufs, pObj );
    }
    // shrink the arrays
    Vec_PtrShrink( p->vPis, Ivy_ManPiNum(p) - nLatches );
    Vec_PtrShrink( p->vPos, Ivy_ManPoNum(p) - nLatches );
    // update the counters of different objects
    p->nObjs[IVY_PI] -= nLatches;
    p->nObjs[IVY_PO] -= nLatches;
    p->nObjs[IVY_BUF] += nLatches;
    p->nDeleted -= 2 * nLatches;
    // remove dangling nodes
    Ivy_ManCleanup(p);
    Ivy_ManCleanupSeq(p);
/* 
    // check for dangling nodes
    Ivy_ManForEachObj( p, pObj, i )
        if ( !Ivy_ObjIsPi(pObj) && !Ivy_ObjIsPo(pObj) && !Ivy_ObjIsConst1(pObj) )
        {
            assert( Ivy_ObjRefs(pObj) > 0 );
            assert( Ivy_ObjRefs(pObj) == Ivy_ObjFanoutNum(p, pObj) );
        }
*/
    // perform hashing by propagating the buffers
    Ivy_ManPropagateBuffers( p, 0 );
    if ( Ivy_ManBufNum(p) )
        printf( "The number of remaining buffers is %d.\n", Ivy_ManBufNum(p) );
    // fix the levels
    Ivy_ManResetLevels( p );
    // check the resulting network
    if ( !Ivy_ManCheck(p) )
        printf( "Ivy_ManMakeSeq(): The check has failed.\n" );
}